

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

void nn_sock_onleave(nn_ctx *self)

{
  uint uVar1;
  char *pcVar2;
  long in_RDI;
  nn_efd *unaff_retaddr;
  int events;
  nn_sock *sock;
  FILE *__stream;
  long local_20;
  
  if (in_RDI == 0) {
    local_20 = 0;
  }
  else {
    local_20 = in_RDI + -0x78;
  }
  if (*(int *)(local_20 + 0x58) == 2) {
    uVar1 = (**(code **)(**(long **)(local_20 + 0x60) + 0x30))(*(undefined8 *)(local_20 + 0x60));
    if ((int)uVar1 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)-uVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x30b);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((*(uint *)(*(long *)(local_20 + 0x68) + 8) & 1) == 0) {
      if ((uVar1 & 1) == 0) {
        if ((*(uint *)(local_20 + 0x70) & 1) != 0) {
          *(uint *)(local_20 + 0x70) = *(uint *)(local_20 + 0x70) & 0xfffffffe;
          nn_efd_unsignal(unaff_retaddr);
        }
      }
      else if ((*(uint *)(local_20 + 0x70) & 1) == 0) {
        *(uint *)(local_20 + 0x70) = *(uint *)(local_20 + 0x70) | 1;
        nn_efd_signal(unaff_retaddr);
      }
    }
    if ((*(uint *)(*(long *)(local_20 + 0x68) + 8) & 2) == 0) {
      if ((uVar1 & 2) == 0) {
        if ((*(uint *)(local_20 + 0x70) & 2) != 0) {
          *(uint *)(local_20 + 0x70) = *(uint *)(local_20 + 0x70) & 0xfffffffd;
          nn_efd_unsignal(unaff_retaddr);
        }
      }
      else if ((*(uint *)(local_20 + 0x70) & 2) == 0) {
        *(uint *)(local_20 + 0x70) = *(uint *)(local_20 + 0x70) | 2;
        nn_efd_signal(unaff_retaddr);
      }
    }
  }
  return;
}

Assistant:

static void nn_sock_onleave (struct nn_ctx *self)
{
    struct nn_sock *sock;
    int events;

    sock = nn_cont (self, struct nn_sock, ctx);

    /*  If nn_close() was already called there's no point in adjusting the
        snd/rcv file descriptors. */
    if (nn_slow (sock->state != NN_SOCK_STATE_ACTIVE))
        return;

    /*  Check whether socket is readable and/or writable at the moment. */
    events = sock->sockbase->vfptr->events (sock->sockbase);
    errnum_assert (events >= 0, -events);

    /*  Signal/unsignal IN as needed. */
    if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)) {
        if (events & NN_SOCKBASE_EVENT_IN) {
            if (!(sock->flags & NN_SOCK_FLAG_IN)) {
                sock->flags |= NN_SOCK_FLAG_IN;
                nn_efd_signal (&sock->rcvfd);
            }
        }
        else {
            if (sock->flags & NN_SOCK_FLAG_IN) {
                sock->flags &= ~NN_SOCK_FLAG_IN;
                nn_efd_unsignal (&sock->rcvfd);
            }
        }
    }

    /*  Signal/unsignal OUT as needed. */
    if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)) {
        if (events & NN_SOCKBASE_EVENT_OUT) {
            if (!(sock->flags & NN_SOCK_FLAG_OUT)) {
                sock->flags |= NN_SOCK_FLAG_OUT;
                nn_efd_signal (&sock->sndfd);
            }
        }
        else {
            if (sock->flags & NN_SOCK_FLAG_OUT) {
                sock->flags &= ~NN_SOCK_FLAG_OUT;
                nn_efd_unsignal (&sock->sndfd);
            }
        }
    }
}